

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

void run_container_append(run_container_t *run,rle16_t vl,rle16_t *previousrl)

{
  uint uVar1;
  uint uVar2;
  uint32_t newend;
  uint32_t previousend;
  rle16_t *previousrl_local;
  run_container_t *run_local;
  rle16_t vl_local;
  
  uVar1 = (uint)previousrl->value + (uint)previousrl->length;
  if (uVar1 + 1 < ((uint)vl & 0xffff)) {
    run->runs[run->n_runs] = vl;
    run->n_runs = run->n_runs + 1;
    *previousrl = vl;
  }
  else {
    uVar2 = ((uint)vl & 0xffff) + ((uint)vl >> 0x10) + 1;
    if (uVar1 < uVar2) {
      previousrl->length = ((short)uVar2 + -1) - previousrl->value;
      run->runs[run->n_runs + -1] = *previousrl;
    }
  }
  return;
}

Assistant:

static inline void run_container_append(run_container_t *run, rle16_t vl,
                                        rle16_t *previousrl) {
    const uint32_t previousend = previousrl->value + previousrl->length;
    if (vl.value > previousend + 1) {  // we add a new one
        run->runs[run->n_runs] = vl;
        run->n_runs++;
        *previousrl = vl;
    } else {
        uint32_t newend = vl.value + vl.length + UINT32_C(1);
        if (newend > previousend) {  // we merge
            previousrl->length = (uint16_t)(newend - 1 - previousrl->value);
            run->runs[run->n_runs - 1] = *previousrl;
        }
    }
}